

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

int countint(TValue *key,uint *nums)

{
  int iVar1;
  uint x;
  Value VVar2;
  
  if ((key->tt_ != 0x13) ||
     (VVar2 = key->value_, VVar2.f + -0x80000001 < (code *)0xffffffff80000000)) {
    VVar2.gc = (GCObject *)0x0;
  }
  x = VVar2.b;
  if (x != 0) {
    iVar1 = luaO_ceillog2(x);
    nums[iVar1] = nums[iVar1] + 1;
  }
  return (uint)(x != 0);
}

Assistant:

static int countint (const TValue *key, unsigned int *nums) {
  unsigned int k = arrayindex(key);
  if (k != 0) {  /* is 'key' an appropriate array index? */
    nums[luaO_ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}